

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O0

void __thiscall GeneticAlgorithm::run(GeneticAlgorithm *this)

{
  reference this_00;
  Population local_a0;
  int local_64;
  undefined8 uStack_60;
  int generation;
  double fitness;
  undefined1 local_48 [8];
  Population p;
  GeneticAlgorithm *this_local;
  
  p.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  createBasePopulation((Population *)local_48,this);
  Population::process((Population *)local_48);
  std::vector<Population,_std::allocator<Population>_>::push_back
            (&this->generations,(value_type *)local_48);
  uStack_60 = 0x3f50624dd2f1a9fc;
  local_64 = 0;
  while ((ulong)(long)local_64 < params.generations) {
    local_64 = local_64 + 1;
    Population::tournament_selection(&local_a0,(Population *)local_48,local_64);
    Population::operator=((Population *)local_48,&local_a0);
    Population::~Population(&local_a0);
    Population::crossover_selection((Population *)local_48,params.crossoverPercent);
    Population::mutation((Population *)local_48,params.mutationPercent);
    Population::process((Population *)local_48);
    Population::calcDiversity((Population *)local_48);
    std::vector<Population,_std::allocator<Population>_>::push_back
              (&this->generations,(value_type *)local_48);
  }
  this_00 = std::vector<Population,_std::allocator<Population>_>::back(&this->generations);
  Population::printBestCandidate(this_00);
  resultAsJson(this);
  Population::~Population((Population *)local_48);
  return;
}

Assistant:

void GeneticAlgorithm::run() {


    Population p = createBasePopulation();
    p.process();
    generations.push_back(p);

    double fitness = 0.001;
    int generation = 0;

    while(generation < params.generations){
        //p.printChromos();
        generation++;
        p = p.tournament_selection(generation);
        p.crossover_selection(params.crossoverPercent);
        p.mutation(params.mutationPercent);
        p.process();

        p.calcDiversity();
        //p.printBestCandidate();
       // std::cout << "Min Fitness: " << p.minFitness << std::endl;
       // std::cout << "Max Fitness: " << p.maxFitness << std::endl;

        generations.push_back(p);
     }

    generations.back().printBestCandidate();

    //resultToFile();
    resultAsJson();
}